

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::AdagradTrainer::update(AdagradTrainer *this,real scale)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  Model *pMVar5;
  undefined8 *puVar6;
  Parameters *this_00;
  pointer pSVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  LookupParameters *this_01;
  pointer pSVar12;
  pointer pTVar13;
  pointer pTVar14;
  long lVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  _Hash_node_base *p_Var19;
  uint i_2;
  ulong uVar20;
  undefined8 *puVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  uint uVar26;
  Index size;
  uint p_2;
  ulong uVar27;
  int iVar28;
  uint p_1;
  int iVar29;
  uint uVar30;
  Index index_3;
  uint p;
  uint uVar31;
  Index index;
  Index index_5;
  Index index_1;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  Index size_2;
  uint i;
  ulong uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar52;
  float fVar55;
  float fVar56;
  undefined1 in_XMM10 [16];
  undefined1 auVar53 [16];
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  ulong local_c8;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_68;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_48;
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_48);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_48);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    this->shadow_params_allocated = true;
  }
  fVar36 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar5 = (this->super_Trainer).model;
  puVar21 = *(undefined8 **)(pMVar5 + 0x18);
  puVar6 = *(undefined8 **)(pMVar5 + 0x20);
  if (puVar21 != puVar6) {
    fVar58 = fVar36 * scale;
    uVar34 = 0;
    do {
      this_00 = (Parameters *)*puVar21;
      uVar22 = (ulong)(this_00->values).d.nd;
      iVar29 = 1;
      iVar28 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar28 = iVar28 * (this_00->values).d.d[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      uVar22 = (ulong)(this_00->g).d.nd;
      if (uVar22 != 0) {
        iVar29 = 1;
        uVar20 = 0;
        do {
          iVar29 = iVar29 * (this_00->g).d.d[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      pSVar7 = (this->vp).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar22 = (ulong)pSVar7[uVar34].h.d.nd;
      iVar25 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar25 = iVar25 * *(int *)((long)pSVar7[uVar34].h.d.d + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      uVar30 = iVar29 * (this_00->g).d.bd;
      uVar26 = iVar25 * pSVar7[uVar34].h.d.bd;
      uVar22 = (ulong)uVar26;
      if (uVar26 != uVar30) goto LAB_002225a0;
      pfVar8 = pSVar7[uVar34].h.v;
      uVar20 = uVar22;
      if ((((ulong)pfVar8 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar20)) {
        uVar20 = uVar22;
      }
      pfVar9 = (this_00->values).v;
      uVar26 = iVar28 * (this_00->values).d.bd;
      fVar4 = (this->super_Trainer).lambda;
      pfVar10 = (this_00->g).v;
      uVar27 = uVar22 - uVar20;
      uVar32 = uVar27 + 3;
      if (-1 < (long)uVar27) {
        uVar32 = uVar27;
      }
      if (uVar20 != 0) {
        uVar35 = 0;
        do {
          pfVar8[uVar35] = pfVar10[uVar35] * fVar58 * pfVar10[uVar35] * fVar58 + pfVar8[uVar35];
          uVar35 = uVar35 + 1;
        } while (uVar20 != uVar35);
      }
      uVar32 = (uVar32 & 0xfffffffffffffffc) + uVar20;
      if (3 < (long)uVar27) {
        do {
          pfVar11 = pfVar10 + uVar20;
          fVar38 = pfVar11[1];
          fVar37 = pfVar11[2];
          fVar52 = pfVar11[3];
          pfVar3 = pfVar8 + uVar20;
          fVar55 = pfVar3[1];
          fVar56 = pfVar3[2];
          fVar57 = pfVar3[3];
          pfVar1 = pfVar8 + uVar20;
          *pfVar1 = *pfVar11 * fVar58 * *pfVar11 * fVar58 + *pfVar3;
          pfVar1[1] = fVar38 * fVar58 * fVar38 * fVar58 + fVar55;
          pfVar1[2] = fVar37 * fVar58 * fVar37 * fVar58 + fVar56;
          pfVar1[3] = fVar52 * fVar58 * fVar52 * fVar58 + fVar57;
          uVar20 = uVar20 + 4;
        } while ((long)uVar20 < (long)uVar32);
      }
      if ((long)uVar32 < (long)uVar22) {
        do {
          pfVar8[uVar32] = pfVar10[uVar32] * fVar58 * pfVar10[uVar32] * fVar58 + pfVar8[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar22 != uVar32);
      }
      pfVar8 = pSVar7[uVar34].h.v;
      uVar22 = (ulong)pSVar7[uVar34].h.d.nd;
      iVar28 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar28 = iVar28 * *(int *)((long)pSVar7[uVar34].h.d.d + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      uVar31 = iVar28 * pSVar7[uVar34].h.d.bd;
      if (uVar30 != uVar31) goto LAB_00222589;
      if (uVar31 != uVar26) goto LAB_002225bf;
      uVar22 = (ulong)(this_00->values).d.nd;
      iVar28 = 1;
      if (uVar22 != 0) {
        uVar20 = 0;
        do {
          iVar28 = iVar28 * (this_00->values).d.d[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      uVar30 = iVar28 * (this_00->values).d.bd;
      uVar22 = (ulong)uVar30;
      if (uVar30 != uVar26) goto LAB_00222572;
      pfVar11 = (this_00->values).v;
      uVar20 = uVar22;
      if ((((ulong)pfVar11 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar20)) {
        uVar20 = uVar22;
      }
      fVar37 = -(this->super_Trainer).eta;
      fVar38 = this->epsilon;
      uVar27 = uVar22 - uVar20;
      uVar32 = uVar27 + 3;
      if (-1 < (long)uVar27) {
        uVar32 = uVar27;
      }
      if (uVar20 != 0) {
        uVar35 = 0;
        do {
          pfVar11[uVar35] =
               (((pfVar10[uVar35] * fVar58) / SQRT(pfVar8[uVar35] + fVar38)) * fVar37 -
               pfVar9[uVar35] * fVar4) + pfVar11[uVar35];
          uVar35 = uVar35 + 1;
        } while (uVar20 != uVar35);
      }
      uVar32 = (uVar32 & 0xfffffffffffffffc) + uVar20;
      if (3 < (long)uVar27) {
        do {
          pfVar3 = pfVar8 + uVar20;
          auVar47._0_4_ = *pfVar3 + fVar38;
          auVar47._4_4_ = pfVar3[1] + fVar38;
          auVar47._8_4_ = pfVar3[2] + fVar38;
          auVar47._12_4_ = pfVar3[3] + fVar38;
          auVar41._0_4_ = -(uint)((int)auVar47._0_4_ < 0);
          auVar41._4_4_ = -(uint)((int)auVar47._4_4_ < 0);
          auVar41._8_4_ = -(uint)((int)auVar47._8_4_ < 0);
          auVar41._12_4_ = -(uint)((int)auVar47._12_4_ < 0);
          auVar53 = rsqrtps(in_XMM10,auVar47);
          fVar52 = auVar53._0_4_;
          fVar55 = auVar53._4_4_;
          fVar56 = auVar53._8_4_;
          fVar57 = auVar53._12_4_;
          auVar53 = auVar47 & _DAT_00228cb0;
          iVar28 = auVar53._0_4_;
          iVar29 = auVar53._4_4_;
          iVar25 = auVar53._8_4_;
          iVar51 = auVar53._12_4_;
          auVar49._0_4_ = -(uint)(-0x7f800002 < (int)(iVar28 - 1U ^ 0x80000000));
          auVar49._4_4_ = -(uint)(-0x7f800002 < (int)(iVar29 - 1U ^ 0x80000000));
          auVar49._8_4_ = -(uint)(-0x7f800002 < (int)(iVar25 - 1U ^ 0x80000000));
          auVar49._12_4_ = -(uint)(-0x7f800002 < (int)(iVar51 - 1U ^ 0x80000000));
          auVar39._0_4_ = -(uint)(iVar28 == 0x7f800000);
          auVar39._4_4_ = -(uint)(iVar29 == 0x7f800000);
          auVar39._8_4_ = -(uint)(iVar25 == 0x7f800000);
          auVar39._12_4_ = -(uint)(iVar51 == 0x7f800000);
          in_XMM10._0_4_ = -(uint)(0x7f800000 < iVar28);
          in_XMM10._4_4_ = -(uint)(0x7f800000 < iVar29);
          in_XMM10._8_4_ = -(uint)(0x7f800000 < iVar25);
          in_XMM10._12_4_ = -(uint)(0x7f800000 < iVar51);
          in_XMM10 = in_XMM10 | auVar39;
          auVar40._0_4_ = -(uint)((int)(iVar28 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar40._4_4_ = -(uint)((int)(iVar29 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar40._8_4_ = -(uint)((int)(iVar25 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar40._12_4_ = -(uint)((int)(iVar51 - 0x800000U ^ 0x80000000) < -0x1000000);
          auVar41 = auVar40 | in_XMM10 | ~auVar49 & auVar41;
          pfVar3 = pfVar10 + uVar20;
          auVar42._0_4_ = *pfVar3 * fVar58;
          auVar42._4_4_ = pfVar3[1] * fVar58;
          auVar42._8_4_ = pfVar3[2] * fVar58;
          auVar42._12_4_ = pfVar3[3] * fVar58;
          auVar53._4_4_ =
               (uint)((fVar55 * fVar55 * auVar47._4_4_ * -0.5 + 1.5) * fVar55 * auVar47._4_4_) &
               auVar41._4_4_;
          auVar53._0_4_ =
               (uint)((fVar52 * fVar52 * auVar47._0_4_ * -0.5 + 1.5) * fVar52 * auVar47._0_4_) &
               auVar41._0_4_;
          auVar53._8_4_ =
               (uint)((fVar56 * fVar56 * auVar47._8_4_ * -0.5 + 1.5) * fVar56 * auVar47._8_4_) &
               auVar41._8_4_;
          auVar53._12_4_ =
               (uint)((fVar57 * fVar57 * auVar47._12_4_ * -0.5 + 1.5) * fVar57 * auVar47._12_4_) &
               auVar41._12_4_;
          auVar53 = divps(auVar42,auVar53);
          pfVar3 = pfVar9 + uVar20;
          fVar52 = pfVar3[1];
          fVar55 = pfVar3[2];
          fVar56 = pfVar3[3];
          pfVar1 = pfVar11 + uVar20;
          fVar57 = pfVar1[1];
          fVar17 = pfVar1[2];
          fVar18 = pfVar1[3];
          pfVar2 = pfVar11 + uVar20;
          *pfVar2 = (auVar53._0_4_ * fVar37 - *pfVar3 * fVar4) + *pfVar1;
          pfVar2[1] = (auVar53._4_4_ * fVar37 - fVar52 * fVar4) + fVar57;
          pfVar2[2] = (auVar53._8_4_ * fVar37 - fVar55 * fVar4) + fVar17;
          pfVar2[3] = (auVar53._12_4_ * fVar37 - fVar56 * fVar4) + fVar18;
          uVar20 = uVar20 + 4;
        } while ((long)uVar20 < (long)uVar32);
      }
      if ((long)uVar32 < (long)uVar22) {
        do {
          pfVar11[uVar32] =
               (((pfVar10[uVar32] * fVar58) / SQRT(pfVar8[uVar32] + fVar38)) * fVar37 -
               pfVar9[uVar32] * fVar4) + pfVar11[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar22 != uVar32);
      }
      uVar34 = (ulong)((int)uVar34 + 1);
      Parameters::clear(this_00);
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar6);
  }
  pMVar5 = (this->super_Trainer).model;
  puVar21 = *(undefined8 **)(pMVar5 + 0x30);
  puVar6 = *(undefined8 **)(pMVar5 + 0x38);
  if (puVar21 != puVar6) {
    fVar36 = fVar36 * scale;
    local_c8 = 0;
    do {
      this_01 = (LookupParameters *)*puVar21;
      p_Var19 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var19 != (_Hash_node_base *)0x0) {
        pSVar12 = (this->vlp).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar34 = (ulong)*(uint *)&p_Var19[1]._M_nxt;
          pTVar13 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar22 = (ulong)pTVar13[uVar34].d.nd;
          iVar29 = 1;
          iVar28 = 1;
          if (uVar22 != 0) {
            uVar20 = 0;
            do {
              iVar28 = iVar28 * pTVar13[uVar34].d.d[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          pTVar14 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar22 = (ulong)pTVar14[uVar34].d.nd;
          if (uVar22 != 0) {
            iVar29 = 1;
            uVar20 = 0;
            do {
              iVar29 = iVar29 * pTVar14[uVar34].d.d[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          lVar33 = *(long *)&pSVar12[local_c8].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar34 * 0x48;
          iVar25 = 1;
          if ((ulong)*(uint *)(lVar33 + 0x1c) != 0) {
            uVar22 = 0;
            do {
              iVar25 = iVar25 * *(int *)(lVar33 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (*(uint *)(lVar33 + 0x1c) != uVar22);
          }
          uVar26 = iVar29 * pTVar14[uVar34].d.bd;
          uVar30 = iVar25 * *(int *)(lVar33 + 0x20);
          uVar22 = (ulong)uVar30;
          if (uVar30 != uVar26) goto LAB_002225a0;
          uVar20 = *(ulong *)(lVar33 + 0x28);
          uVar32 = uVar22;
          if (((uVar20 & 3) == 0) &&
             (uVar32 = (ulong)(-((uint)(uVar20 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar32)) {
            uVar32 = uVar22;
          }
          pfVar8 = pTVar13[uVar34].v;
          uVar30 = iVar28 * pTVar13[uVar34].d.bd;
          fVar58 = (this->super_Trainer).lambda;
          pfVar9 = pTVar14[uVar34].v;
          uVar35 = uVar22 - uVar32;
          uVar27 = uVar35 + 3;
          if (-1 < (long)uVar35) {
            uVar27 = uVar35;
          }
          if (uVar32 != 0) {
            uVar23 = 0;
            do {
              *(float *)(uVar20 + uVar23 * 4) =
                   pfVar9[uVar23] * fVar36 * pfVar9[uVar23] * fVar36 +
                   *(float *)(uVar20 + uVar23 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar32 != uVar23);
          }
          uVar27 = (uVar27 & 0xfffffffffffffffc) + uVar32;
          if (3 < (long)uVar35) {
            do {
              pfVar10 = pfVar9 + uVar32;
              fVar4 = pfVar10[1];
              fVar38 = pfVar10[2];
              fVar37 = pfVar10[3];
              pfVar11 = (float *)(uVar20 + uVar32 * 4);
              fVar52 = pfVar11[1];
              fVar55 = pfVar11[2];
              fVar56 = pfVar11[3];
              pfVar3 = (float *)(uVar20 + uVar32 * 4);
              *pfVar3 = *pfVar10 * fVar36 * *pfVar10 * fVar36 + *pfVar11;
              pfVar3[1] = fVar4 * fVar36 * fVar4 * fVar36 + fVar52;
              pfVar3[2] = fVar38 * fVar36 * fVar38 * fVar36 + fVar55;
              pfVar3[3] = fVar37 * fVar36 * fVar37 * fVar36 + fVar56;
              uVar32 = uVar32 + 4;
            } while ((long)uVar32 < (long)uVar27);
          }
          if ((long)uVar27 < (long)uVar22) {
            do {
              *(float *)(uVar20 + uVar27 * 4) =
                   pfVar9[uVar27] * fVar36 * pfVar9[uVar27] * fVar36 +
                   *(float *)(uVar20 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar22 != uVar27);
          }
          lVar15 = *(long *)(lVar33 + 0x28);
          iVar28 = 1;
          if ((ulong)*(uint *)(lVar33 + 0x1c) != 0) {
            uVar22 = 0;
            do {
              iVar28 = iVar28 * *(int *)(lVar33 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (*(uint *)(lVar33 + 0x1c) != uVar22);
          }
          uVar31 = iVar28 * *(int *)(lVar33 + 0x20);
          if (uVar26 != uVar31) goto LAB_00222589;
          if (uVar31 != uVar30) goto LAB_002225bf;
          pTVar13 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar22 = (ulong)pTVar13[uVar34].d.nd;
          iVar28 = 1;
          if (uVar22 != 0) {
            uVar20 = 0;
            do {
              iVar28 = iVar28 * pTVar13[uVar34].d.d[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          uVar26 = iVar28 * pTVar13[uVar34].d.bd;
          uVar22 = (ulong)uVar26;
          if (uVar26 != uVar30) goto LAB_00222572;
          pfVar10 = pTVar13[uVar34].v;
          uVar34 = uVar22;
          if ((((ulong)pfVar10 & 3) == 0) &&
             (uVar34 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 3), uVar22 <= uVar34))
          {
            uVar34 = uVar22;
          }
          fVar38 = -(this->super_Trainer).eta;
          fVar4 = this->epsilon;
          uVar32 = uVar22 - uVar34;
          uVar20 = uVar32 + 3;
          if (-1 < (long)uVar32) {
            uVar20 = uVar32;
          }
          if (uVar34 != 0) {
            uVar27 = 0;
            do {
              pfVar10[uVar27] =
                   (((pfVar9[uVar27] * fVar36) / SQRT(*(float *)(lVar15 + uVar27 * 4) + fVar4)) *
                    fVar38 - pfVar8[uVar27] * fVar58) + pfVar10[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar34 != uVar27);
          }
          uVar20 = (uVar20 & 0xfffffffffffffffc) + uVar34;
          if (3 < (long)uVar32) {
            do {
              pfVar11 = (float *)(lVar15 + uVar34 * 4);
              auVar48._0_4_ = *pfVar11 + fVar4;
              auVar48._4_4_ = pfVar11[1] + fVar4;
              auVar48._8_4_ = pfVar11[2] + fVar4;
              auVar48._12_4_ = pfVar11[3] + fVar4;
              auVar43._0_4_ = -(uint)((int)auVar48._0_4_ < 0);
              auVar43._4_4_ = -(uint)((int)auVar48._4_4_ < 0);
              auVar43._8_4_ = -(uint)((int)auVar48._8_4_ < 0);
              auVar43._12_4_ = -(uint)((int)auVar48._12_4_ < 0);
              auVar53 = rsqrtps(in_XMM10,auVar48);
              fVar37 = auVar53._0_4_;
              fVar52 = auVar53._4_4_;
              fVar55 = auVar53._8_4_;
              fVar56 = auVar53._12_4_;
              auVar53 = auVar48 & _DAT_00228cb0;
              iVar28 = auVar53._0_4_;
              iVar29 = auVar53._4_4_;
              iVar25 = auVar53._8_4_;
              iVar51 = auVar53._12_4_;
              auVar50._0_4_ = -(uint)(-0x7f800002 < (int)(iVar28 - 1U ^ 0x80000000));
              auVar50._4_4_ = -(uint)(-0x7f800002 < (int)(iVar29 - 1U ^ 0x80000000));
              auVar50._8_4_ = -(uint)(-0x7f800002 < (int)(iVar25 - 1U ^ 0x80000000));
              auVar50._12_4_ = -(uint)(-0x7f800002 < (int)(iVar51 - 1U ^ 0x80000000));
              auVar44._0_4_ = -(uint)(iVar28 == 0x7f800000);
              auVar44._4_4_ = -(uint)(iVar29 == 0x7f800000);
              auVar44._8_4_ = -(uint)(iVar25 == 0x7f800000);
              auVar44._12_4_ = -(uint)(iVar51 == 0x7f800000);
              auVar54._0_4_ = -(uint)(0x7f800000 < iVar28);
              auVar54._4_4_ = -(uint)(0x7f800000 < iVar29);
              auVar54._8_4_ = -(uint)(0x7f800000 < iVar25);
              auVar54._12_4_ = -(uint)(0x7f800000 < iVar51);
              in_XMM10 = auVar54 | auVar44;
              auVar45._0_4_ = -(uint)((int)(iVar28 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar45._4_4_ = -(uint)((int)(iVar29 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar45._8_4_ = -(uint)((int)(iVar25 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar45._12_4_ = -(uint)((int)(iVar51 - 0x800000U ^ 0x80000000) < -0x1000000);
              auVar53 = auVar45 | in_XMM10 | ~auVar50 & auVar43;
              pfVar11 = pfVar9 + uVar34;
              auVar46._0_4_ = *pfVar11 * fVar36;
              auVar46._4_4_ = pfVar11[1] * fVar36;
              auVar46._8_4_ = pfVar11[2] * fVar36;
              auVar46._12_4_ = pfVar11[3] * fVar36;
              auVar16._4_4_ =
                   (uint)((fVar52 * fVar52 * auVar48._4_4_ * -0.5 + 1.5) * fVar52 * auVar48._4_4_) &
                   auVar53._4_4_;
              auVar16._0_4_ =
                   (uint)((fVar37 * fVar37 * auVar48._0_4_ * -0.5 + 1.5) * fVar37 * auVar48._0_4_) &
                   auVar53._0_4_;
              auVar16._8_4_ =
                   (uint)((fVar55 * fVar55 * auVar48._8_4_ * -0.5 + 1.5) * fVar55 * auVar48._8_4_) &
                   auVar53._8_4_;
              auVar16._12_4_ =
                   (uint)((fVar56 * fVar56 * auVar48._12_4_ * -0.5 + 1.5) * fVar56 * auVar48._12_4_)
                   & auVar53._12_4_;
              auVar53 = divps(auVar46,auVar16);
              pfVar11 = pfVar8 + uVar34;
              fVar37 = pfVar11[1];
              fVar52 = pfVar11[2];
              fVar55 = pfVar11[3];
              pfVar3 = pfVar10 + uVar34;
              fVar56 = pfVar3[1];
              fVar57 = pfVar3[2];
              fVar17 = pfVar3[3];
              pfVar1 = pfVar10 + uVar34;
              *pfVar1 = (auVar53._0_4_ * fVar38 - *pfVar11 * fVar58) + *pfVar3;
              pfVar1[1] = (auVar53._4_4_ * fVar38 - fVar37 * fVar58) + fVar56;
              pfVar1[2] = (auVar53._8_4_ * fVar38 - fVar52 * fVar58) + fVar57;
              pfVar1[3] = (auVar53._12_4_ * fVar38 - fVar55 * fVar58) + fVar17;
              uVar34 = uVar34 + 4;
            } while ((long)uVar34 < (long)uVar20);
          }
          if ((long)uVar20 < (long)uVar22) {
            do {
              pfVar10[uVar20] =
                   (((pfVar9[uVar20] * fVar36) / SQRT(*(float *)(lVar15 + uVar20 * 4) + fVar4)) *
                    fVar38 - pfVar8[uVar20] * fVar58) + pfVar10[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
          }
          p_Var19 = p_Var19->_M_nxt;
        } while (p_Var19 != (_Hash_node_base *)0x0);
      }
      local_c8 = (ulong)((int)local_c8 + 1);
      LookupParameters::clear(this_01);
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar6);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_002225a0:
  pcVar24 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
  goto LAB_002225b5;
LAB_00222589:
  pcVar24 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_002225d4;
LAB_002225bf:
  pcVar24 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs ..." /* TRUNCATED STRING LITERAL */
  ;
LAB_002225d4:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar24);
LAB_00222572:
  pcVar24 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
LAB_002225b5:
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar24);
}

Assistant:

void AdagradTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  pi = 0;
  const float gscale = clip_gradients();
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    auto g = scale * gscale * p->g.vec();
    auto g2 = g.cwiseProduct(g);
    v.vec() += g2;
    auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
    p->values.vec() += delta - reg;
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = p->values[i].vec() * lambda;
      auto g = scale * gscale * p->grads[i].vec();
      auto g2 = g.cwiseProduct(g);
      v.vec() += g2;
      auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
  }

  ++updates;
}